

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectMTx(MT *pMT)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  MT *pMT_local;
  
  local_1c = 0;
  do {
    if ((MT *)addrsMT[local_1c] == pMT) {
      iVar1 = DisconnectMT(pMT);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsMT[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectMTx(MT* pMT)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsMT[id] != pMT)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectMT(pMT);
	if (res != EXIT_SUCCESS) return res;

	addrsMT[id] = NULL;

	return EXIT_SUCCESS;
}